

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::CMP_OP(SQVM *this,CmpOP op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *res)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  bool bVar3;
  SQObjectValue SVar4;
  SQInteger r;
  ulong local_20;
  
  bVar3 = ObjCmp(this,o1,o2,(SQInteger *)&local_20);
  if (!bVar3) {
    return bVar3;
  }
  switch(op) {
  case CMP_G:
    if (((res->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    bVar2 = 0 < (long)local_20;
    goto LAB_00159d6b;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqvm.cpp"
                  ,0x117,
                  "bool SQVM::CMP_OP(CmpOP, const SQObjectPtr &, const SQObjectPtr &, SQObjectPtr &)"
                 );
  case CMP_GE:
    if (((res->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (res->super_SQObject)._type = OT_BOOL;
    local_20 = ~local_20;
    break;
  case CMP_L:
    if (((res->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (res->super_SQObject)._type = OT_BOOL;
    break;
  case CMP_LE:
    if (((res->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    bVar2 = (long)local_20 < 1;
LAB_00159d6b:
    SVar4.nInteger._1_7_ = 0;
    SVar4.nInteger._0_1_ = bVar2;
    (res->super_SQObject)._type = OT_BOOL;
    (res->super_SQObject)._unVal = SVar4;
    return bVar3;
  case CMP_3W:
    if (((res->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (res->super_SQObject)._type = OT_INTEGER;
    goto LAB_00159da3;
  }
  local_20 = local_20 >> 0x3f;
LAB_00159da3:
  (res->super_SQObject)._unVal.nInteger = local_20;
  return bVar3;
}

Assistant:

bool SQVM::CMP_OP(CmpOP op, const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &res)
{
    SQInteger r;
    if(ObjCmp(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}